

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarization.cpp
# Opt level: O0

binarization * __thiscall
pobr::imgProcessing::utils::binarization::invertBinaryImage(binarization *this,Mat *img)

{
  Mat *img_00;
  anon_class_8_1_a9240d06 local_48;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_40;
  undefined1 local_19;
  Mat *local_18;
  Mat *img_local;
  Mat *resultImg;
  
  local_19 = 0;
  local_18 = img;
  img_local = (Mat *)this;
  cv::Mat::clone();
  img_00 = local_18;
  local_48.resultImg = (Mat *)this;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::binarization::invertBinaryImage(cv::Mat_const&)::__0,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_40,&local_48);
  matrixOps::forEachPixel(img_00,&local_40);
  std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::~function(&local_40);
  return this;
}

Assistant:

cv::Mat
binarization::invertBinaryImage(const cv::Mat& img)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = resultImg.at<cv::Vec3b>(y, x);
            uint8_t value = 255 - thisPixel[0];

            thisPixel[0] = value;
            thisPixel[1] = value;
            thisPixel[2] = value;
        }
    );

    return resultImg;
}